

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddDefinition(void *arg,char *name,char *value)

{
  allocator local_49;
  string local_48;
  void *local_28;
  cmMakefile *mf;
  char *value_local;
  char *name_local;
  void *arg_local;
  
  local_28 = arg;
  mf = (cmMakefile *)value;
  value_local = name;
  name_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,name,&local_49);
  cmMakefile::AddDefinition((cmMakefile *)arg,&local_48,(char *)mf);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void CCONV cmAddDefinition(void *arg, const char* name, const char* value)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  mf->AddDefinition(name,value);
}